

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O3

int compare_zip(char **zn)

{
  char **ppcVar1;
  bool bVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *puVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  void *pvVar12;
  char *pcVar13;
  FILE *__stream;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  int *piVar18;
  char *pcVar19;
  ushort uVar20;
  long lVar21;
  FILE *pFVar22;
  bool bVar23;
  undefined8 *puVar24;
  char *__format;
  code *check;
  ulong uVar25;
  long lVar26;
  char *pcVar27;
  ulong uVar28;
  int err;
  zip_uint64_t n [2];
  archive a [2];
  entry *e [2];
  ulong local_2118;
  undefined4 local_20ec;
  char **local_20e8;
  undefined8 *local_20e0;
  char *local_20d8;
  char *local_20d0;
  long local_20c0;
  uint local_20a8;
  ushort local_20a4;
  undefined8 local_2098 [2];
  char *pcStack_2088;
  __dev_t local_2080;
  void *pvStack_2078;
  size_t local_2070;
  undefined8 local_2068 [2];
  char *local_2058;
  __ino_t local_2050;
  void *local_2048;
  size_t local_2040;
  stat local_2038 [56];
  
  puVar8 = local_2098;
  lVar9 = 0;
  local_20e8 = zn;
  bVar2 = true;
  do {
    bVar23 = bVar2;
    ppcVar1 = local_20e8;
    pcVar13 = local_20e8[lVar9];
    *puVar8 = pcVar13;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
    iVar5 = stat(pcVar13,local_2038);
    pcVar13 = ppcVar1[lVar9];
    if ((-1 < iVar5) && ((local_2038[0].st_mode & 0xf000) == 0x4000)) {
      local_20d0 = (char *)0x0;
      local_20d8 = pcVar13;
      lVar9 = fts_open(&local_20d8,6,0);
      pFVar22 = _stderr;
      pcVar27 = progname;
      if (lVar9 == 0) {
        piVar18 = __errno_location();
        pcVar19 = strerror(*piVar18);
        __format = "%s: can\'t open directory \'%s\': %s\n";
      }
      else {
        sVar10 = strlen(pcVar13);
        lVar11 = fts_read(lVar9);
        if (lVar11 == 0) {
          pvVar12 = (void *)0x0;
          uVar25 = 0;
        }
        else {
          pvVar12 = (void *)0x0;
          uVar25 = 0;
          local_2118 = 0;
          do {
            uVar3 = *(ushort *)(lVar11 + 0x62);
            if (uVar3 < 0xe) {
              if (uVar3 == 8) {
                if (local_2118 <= uVar25) {
                  local_2118 = local_2118 + 0x10;
                  if (0x492492492492492 < local_2118) goto LAB_00102cdf;
                  pvVar12 = realloc(pvVar12,local_2118 * 0x38);
                  puVar8[3] = pvVar12;
                  if (pvVar12 == (void *)0x0) goto LAB_00102cdf;
                }
                pcVar13 = strdup((char *)(*(long *)(lVar11 + 0x30) + sVar10 + 1));
                lVar21 = uVar25 * 0x38;
                *(char **)((long)pvVar12 + lVar21) = pcVar13;
                *(undefined8 *)((long)pvVar12 + lVar21 + 8) =
                     *(undefined8 *)(*(long *)(lVar11 + 0x68) + 0x30);
                pcVar13 = *(char **)(lVar11 + 0x28);
                lVar11 = crc32(0,0,0);
                __stream = fopen(pcVar13,"rb");
                pFVar22 = _stderr;
                pcVar27 = progname;
                if (__stream == (FILE *)0x0) {
                  piVar18 = __errno_location();
                  pcVar19 = strerror(*piVar18);
                  fprintf(pFVar22,"%s: can\'t open %s: %s\n",pcVar27,pcVar13,pcVar19);
                }
                else {
                  while (sVar14 = fread(local_2038,1,0x2000,__stream), sVar14 != 0) {
                    lVar11 = crc32(lVar11,local_2038,sVar14 & 0xffffffff);
                  }
                  iVar5 = ferror(__stream);
                  pFVar22 = _stderr;
                  pcVar27 = progname;
                  if (iVar5 == 0) {
                    fclose(__stream);
                    if (-1 < lVar11) {
                      *(int *)((long)pvVar12 + lVar21 + 0x10) = (int)lVar11;
                      uVar25 = uVar25 + 1;
                      puVar8[2] = uVar25;
                      goto LAB_001026ff;
                    }
                  }
                  else {
                    piVar18 = __errno_location();
                    pcVar19 = strerror(*piVar18);
                    fprintf(pFVar22,"%s: read error on %s: %s\n",pcVar27,pcVar13,pcVar19);
                    fclose(__stream);
                  }
                }
              }
              else if ((0x2494U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_001026ff;
              fts_close(lVar9);
              goto LAB_00102c6e;
            }
LAB_001026ff:
            lVar11 = fts_read(lVar9);
          } while (lVar11 != 0);
        }
        iVar5 = fts_close(lVar9);
        pFVar22 = _stderr;
        pcVar27 = progname;
        if (iVar5 == 0) {
          paranoid = 0;
          goto LAB_00102ba1;
        }
        pcVar13 = (char *)*puVar8;
        piVar18 = __errno_location();
        pcVar19 = strerror(*piVar18);
        __format = "%s: error closing directory \'%s\': %s\n";
      }
      fprintf(pFVar22,__format,pcVar27,pcVar13,pcVar19);
      goto LAB_00102c6e;
    }
    lVar9 = zip_open(pcVar13,(ulong)(paranoid != 0) << 2,&local_20ec);
    if (lVar9 == 0) {
      zip_error_init_with_code(local_2038,local_20ec);
      pFVar22 = _stderr;
      pcVar27 = progname;
      uVar17 = zip_error_strerror(local_2038);
      fprintf(pFVar22,"%s: cannot open zip archive \'%s\': %s\n",pcVar27,pcVar13,uVar17);
      zip_error_fini(local_2038);
      goto LAB_00102c6e;
    }
    puVar8[1] = lVar9;
    uVar25 = zip_get_num_entries(lVar9,0);
    puVar8[2] = uVar25;
    if (uVar25 != 0) {
      if (uVar25 < 0x492492492492493) {
        pvVar12 = malloc(uVar25 * 0x38);
        puVar8[3] = pvVar12;
        if (pvVar12 != (void *)0x0) {
          local_20e0 = puVar8 + 4;
          uVar28 = 0;
          do {
            zip_stat_index(lVar9,uVar28,0,&local_20d8);
            pcVar13 = strdup(local_20d0);
            uVar7 = local_20a8;
            lVar11 = local_20c0;
            lVar21 = uVar28 * 0x38;
            *(char **)((long)pvVar12 + lVar21) = pcVar13;
            *(long *)((long)pvVar12 + lVar21 + 8) = local_20c0;
            *(uint *)((long)pvVar12 + lVar21 + 0x10) = local_20a8;
            if (test_files != 0) {
              lVar15 = zip_fopen_index(lVar9,uVar28,0);
              pFVar22 = _stderr;
              pcVar13 = progname;
              if (lVar15 == 0) {
                uVar17 = zip_strerror(lVar9);
                fprintf(pFVar22,"%s: cannot open file %lu in archive: %s\n",pcVar13,uVar28,uVar17);
              }
              else {
                uVar6 = crc32(0,0,0);
                uVar16 = zip_fread(lVar15,local_2038,0x2000);
                lVar26 = 0;
                while (pFVar22 = _stderr, pcVar13 = progname, 0 < (long)uVar16) {
                  lVar26 = lVar26 + uVar16;
                  uVar6 = crc32(uVar6,local_2038,uVar16 & 0xffffffff);
                  uVar16 = zip_fread(lVar15,local_2038,0x2000);
                }
                if ((long)uVar16 < 0) {
                  uVar17 = zip_file_strerror(lVar15);
                  fprintf(pFVar22,"%s: error reading file %lu in archive: %s\n",pcVar13,uVar28,
                          uVar17);
                  zip_fclose(lVar15);
                }
                else {
                  zip_fclose(lVar15);
                  if (lVar26 == lVar11) {
                    if (uVar7 != uVar6) {
                      fprintf(_stderr,"%s: file %lu: unexpected length %x (should be %x)\n",progname
                              ,uVar28,(ulong)uVar6);
                    }
                  }
                  else {
                    fprintf(_stderr,"%s: file %lu: unexpected length %ld (should be %ld)\n",progname
                            ,uVar28,lVar26);
                  }
                }
              }
            }
            if (paranoid == 0) {
              *(undefined4 *)((long)pvVar12 + lVar21 + 0x14) = 0;
              *(undefined2 *)((long)pvVar12 + lVar21 + 0x20) = 0;
            }
            else {
              *(uint *)((long)pvVar12 + lVar21 + 0x14) = (uint)local_20a4;
              uVar3 = zip_file_extra_fields_count(lVar9,uVar28,0x100);
              if ((-1 < (short)uVar3) &&
                 (sVar4 = zip_file_extra_fields_count(lVar9,uVar28,0x200), -1 < sVar4)) {
                puVar24 = (undefined8 *)((long)pvVar12 + lVar21);
                uVar20 = sVar4 + uVar3;
                *(ushort *)(puVar24 + 4) = uVar20;
                pvVar12 = malloc((ulong)uVar20 * 0x18);
                puVar24[3] = pvVar12;
                if (pvVar12 != (void *)0x0) {
                  if (uVar3 != 0) {
                    lVar11 = 0;
                    uVar25 = 0;
                    do {
                      *(undefined8 *)((long)pvVar12 + lVar11) = *puVar24;
                      lVar15 = zip_file_extra_field_get
                                         (lVar9,uVar28,uVar25 & 0xffff,(long)pvVar12 + lVar11 + 10,
                                          (long)pvVar12 + lVar11 + 0xc);
                      pvVar12 = (void *)puVar24[3];
                      *(long *)((long)pvVar12 + lVar11 + 0x10) = lVar15;
                      if (lVar15 == 0) goto LAB_00102a29;
                      *(undefined2 *)((long)pvVar12 + lVar11 + 8) = 0x100;
                      uVar25 = uVar25 + 1;
                      lVar11 = lVar11 + 0x18;
                    } while (uVar3 != uVar25);
                    uVar20 = *(ushort *)(puVar24 + 4);
                  }
                  if (uVar3 < uVar20) {
                    lVar11 = (ulong)uVar3 * 0x18;
                    uVar25 = 0;
                    do {
                      *(undefined8 *)((long)pvVar12 + lVar11) = *puVar24;
                      lVar15 = zip_file_extra_field_get
                                         (lVar9,uVar28,uVar25 & 0xffff,(long)pvVar12 + lVar11 + 10,
                                          (long)pvVar12 + lVar11 + 0xc);
                      pvVar12 = (void *)puVar24[3];
                      *(long *)((long)pvVar12 + lVar11 + 0x10) = lVar15;
                      if (lVar15 == 0) goto LAB_00102a29;
                      *(undefined2 *)((long)pvVar12 + lVar11 + 8) = 0x200;
                      sVar10 = (size_t)*(ushort *)(puVar24 + 4);
                      lVar15 = uVar3 + uVar25;
                      uVar25 = uVar25 + 1;
                      lVar11 = lVar11 + 0x18;
                    } while (lVar15 + 1U < sVar10);
                  }
                  else {
                    sVar10 = (size_t)uVar20;
                  }
                  qsort(pvVar12,sVar10,0x18,ef_order);
                }
              }
LAB_00102a29:
              pvVar12 = (void *)puVar8[3];
              uVar17 = zip_file_get_comment(lVar9,uVar28,(long)pvVar12 + lVar21 + 0x30,0);
              *(undefined8 *)((long)pvVar12 + lVar21 + 0x28) = uVar17;
              uVar25 = puVar8[2];
            }
            uVar28 = (ulong)((int)uVar28 + 1);
          } while (uVar28 < uVar25);
          if (paranoid == 0) {
            *local_20e0 = 0;
            local_20e0[1] = 0;
          }
          else {
            uVar17 = zip_get_archive_comment(lVar9,local_2038,0);
            puVar8[4] = uVar17;
            puVar8[5] = (long)(int)local_2038[0].st_dev;
          }
          goto LAB_00102ba1;
        }
      }
LAB_00102cdf:
      fprintf(_stderr,"%s: malloc failure\n",progname);
      goto LAB_00102cfe;
    }
    puVar8[3] = 0;
    pvVar12 = (void *)0x0;
    uVar25 = 0;
LAB_00102ba1:
    if (uVar25 != 0) {
      qsort(pvVar12,uVar25,0x38,entry_cmp);
    }
    lVar9 = 1;
    puVar8 = local_2068;
    bVar2 = false;
  } while (bVar23);
  header_done = 0;
  local_2038[0].st_dev = local_2080;
  local_2038[0].st_ino = local_2050;
  local_20d8 = pcStack_2088;
  check = (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0;
  local_20d0 = local_2058;
  if (paranoid != 0) {
    check = entry_paranoia_checks;
  }
  iVar5 = compare_list(local_20e8,(void **)local_2038,(zip_uint64_t *)&local_20d8,0x38,entry_cmp,
                       check,entry_print);
  if (paranoid == 0) goto LAB_00102e6e;
  if (local_2070 == local_2040) {
    if (local_2070 == 0) goto LAB_00102e6e;
    if (pvStack_2078 == (void *)0x0 || local_2048 == (void *)0x0) {
      uVar7 = (uint)(pvStack_2078 == local_2048);
    }
    else {
      uVar7 = memcmp(pvStack_2078,local_2048,local_2070);
    }
    if (uVar7 == 0) goto LAB_00102e6e;
  }
  iVar5 = 1;
  if (verbose != 0) {
    printf("--- archive comment (%zu)\n",local_2070);
    printf("+++ archive comment (%zu)\n",local_2040);
  }
LAB_00102e6e:
  puVar8 = local_2098;
  bVar2 = true;
  do {
    bVar23 = bVar2;
    if (puVar8[1] != 0) {
      zip_close();
    }
    puVar24 = (undefined8 *)puVar8[3];
    lVar9 = puVar8[2];
    puVar8 = puVar24;
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      free((void *)*puVar8);
      puVar8 = puVar8 + 7;
    }
    free(puVar24);
    puVar8 = local_2068;
    bVar2 = false;
  } while (bVar23);
  if (iVar5 == 1) {
LAB_00102cfe:
    exit(1);
  }
  if (iVar5 == 0) {
    exit(0);
  }
LAB_00102c6e:
  exit(2);
}

Assistant:

static int
compare_zip(char *const zn[]) {
    struct archive a[2];
    struct entry *e[2];
    zip_uint64_t n[2];
    int i;
    int res;

    for (i = 0; i < 2; i++) {
	a[i].name = zn[i];
	a[i].entry = NULL;
	a[i].nentry = 0;
	a[i].za = NULL;
	a[i].comment = NULL;
	a[i].comment_length = 0;

	if (is_directory(zn[i])) {
#ifndef HAVE_FTS_H
	    fprintf(stderr, "%s: reading directories not supported\n", progname);
	    exit(2);
#else
	    if (list_directory(zn[i], a + i) < 0)
		exit(2);
	    paranoid = 0; /* paranoid checks make no sense for directories, since they compare zip metadata */
#endif
	}
	else {
	    if (list_zip(zn[i], a + i) < 0)
		exit(2);
	}
	if (a[i].nentry > 0)
	    qsort(a[i].entry, a[i].nentry, sizeof(a[i].entry[0]), entry_cmp);
    }

    header_done = 0;

    e[0] = a[0].entry;
    e[1] = a[1].entry;
    n[0] = a[0].nentry;
    n[1] = a[1].nentry;
    res = compare_list(zn, (const void **)e, n, sizeof(e[i][0]), entry_cmp, paranoid ? entry_paranoia_checks : NULL, entry_print);

    if (paranoid) {
	if (comment_compare(a[0].comment, a[0].comment_length, a[1].comment, a[1].comment_length) != 0) {
	    if (verbose) {
		printf("--- archive comment (%zu)\n", a[0].comment_length);
		printf("+++ archive comment (%zu)\n", a[1].comment_length);
	    }
	    res = 1;
	}
    }

    for (i = 0; i < 2; i++) {
	zip_uint64_t j;

	if (a[i].za) {
	    zip_close(a[i].za);
	}
	for (j = 0; j < a[i].nentry; j++) {
	    free(a[i].entry[j].name);
	}
	free(a[i].entry);
    }

    switch (res) {
    case 0:
	exit(0);

    case 1:
	exit(1);

    default:
	exit(2);
    }
}